

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

cmLinkItem * __thiscall
cmComputeLinkDepends::ResolveLinkItem
          (cmLinkItem *__return_storage_ptr__,cmComputeLinkDepends *this,int depender_index,
          string *name)

{
  cmGeneratorTarget *pcVar1;
  cmGeneratorTarget *this_00;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_48;
  
  this_00 = this->Target;
  if ((-1 < depender_index) &&
     (pcVar1 = (this->EntryList).
               super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
               ._M_impl.super__Vector_impl_data._M_start[(uint)depender_index].Target,
     pcVar1 != (cmGeneratorTarget *)0x0)) {
    this_00 = pcVar1;
  }
  std::__cxx11::string::string((string *)&local_68,(string *)name);
  local_78.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_78.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_78);
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
            (&local_48,&local_68,(cmListFileBacktrace *)&local_78);
  cmGeneratorTarget::ResolveLinkItem(__return_storage_ptr__,this_00,&local_48);
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
            (&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_78.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

cmLinkItem cmComputeLinkDepends::ResolveLinkItem(int depender_index,
                                                 const std::string& name)
{
  // Look for a target in the scope of the depender.
  cmGeneratorTarget const* from = this->Target;
  if (depender_index >= 0) {
    if (cmGeneratorTarget const* depender =
          this->EntryList[depender_index].Target) {
      from = depender;
    }
  }
  return from->ResolveLinkItem(BT<std::string>(name));
}